

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write.hpp
# Opt level: O0

int __thiscall
ovf::detail::write::segment<float>
          (write *this,ovf_file *file,ovf_segment *segment,float *vf,bool append,int format)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  char *pcVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  float n_cols_00;
  float n_rows_00;
  reference output_to_file_00;
  ovf_segment *vf_00;
  bool bVar2;
  size_type sVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined1 *this_01;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *format_str_04;
  void *__buf;
  void *__buf_00;
  undefined7 in_register_00000081;
  char **args_1;
  undefined4 in_register_0000008c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_dc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_cb8;
  exception *ex;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c50;
  string local_c30 [32];
  iterator local_c10;
  size_type local_c08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c00;
  allocator local_be1;
  string local_be0;
  undefined1 local_bc0 [8];
  file_handle handle_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b0;
  iterator local_990;
  size_type local_988;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_980;
  allocator local_961;
  string local_960;
  undefined1 local_940 [8];
  file_handle handle;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  allocator local_6d9;
  string local_6d8;
  allocator local_6b1;
  string local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  allocator local_669;
  string local_668 [8];
  string datatype_out;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  float local_5c8;
  char local_5c4 [4];
  int n_cols;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  allocator local_579;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  float local_434;
  undefined1 local_430 [4];
  int n_rows;
  allocator local_409;
  undefined1 local_408 [8];
  string meshtype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_388;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  allocator local_2c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  int local_240;
  allocator local_239;
  int i_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  int local_1f8;
  allocator local_1f1;
  int i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  reference local_b0;
  string *output_to_file;
  int index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  iterator local_78;
  size_type local_70;
  allocator local_51;
  value_type local_50;
  int local_30;
  byte local_29;
  int format_local;
  bool append_local;
  float *vf_local;
  ovf_segment *segment_local;
  ovf_file *file_local;
  
  args_1 = (char **)CONCAT71(in_register_00000081,append);
  local_29 = (byte)vf & 1;
  local_30 = (int)args_1;
  _format_local = segment;
  vf_local = (float *)file;
  segment_local = (ovf_segment *)this;
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(*(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   **)(this + 0x18));
  if ((sVar3 == 0) || ((local_29 & 1) == 0)) {
    output_to_file._6_1_ = 1;
    _index = &local_98;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_98,"",(allocator *)((long)&output_to_file + 7));
    output_to_file._6_1_ = 0;
    local_78 = &local_98;
    local_70 = 1;
    __l_01._M_len = 1;
    __l_01._M_array = local_78;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)segment_local->valueunits,__l_01);
    vf = (float *)&local_98;
    local_cb8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78;
    do {
      local_cb8 = local_cb8 + -1;
      std::__cxx11::string::~string((string *)local_cb8);
    } while (local_cb8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vf);
    std::allocator<char>::~allocator((allocator<char> *)((long)&output_to_file + 7));
  }
  else {
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)segment_local->valueunits;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_50,"",&local_51);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)segment_local->valueunits);
  output_to_file._0_4_ = (int)sVar3 + -1;
  local_b0 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)segment_local->valueunits,(long)(int)output_to_file);
  std::__cxx11::string::reserve((ulong)local_b0);
  fmt::v5::format<std::__cxx11::string>(&local_d0,(v5 *)empty_line_abi_cxx11_,format_str);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  fmt::v5::format<char[18]>(&local_f0,(char (*) [18])"# Begin: Segment\n");
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  fmt::v5::format<char[17]>(&local_110,(char (*) [17])"# Begin: Header\n");
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_110);
  std::__cxx11::string::~string((string *)&local_110);
  fmt::v5::format<std::__cxx11::string>(&local_130,(v5 *)empty_line_abi_cxx11_,format_str_00);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  fmt::v5::format<char[13],char*>
            (&local_150,(v5 *)"# Title: {}\n",(char (*) [13])vf_local,(char **)vf);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  fmt::v5::format<std::__cxx11::string>(&local_170,(v5 *)empty_line_abi_cxx11_,format_str_01);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_170);
  std::__cxx11::string::~string((string *)&local_170);
  fmt::v5::format<char[12],char*>
            (&local_190,(v5 *)"# Desc: {}\n",(char (*) [12])(vf_local + 2),(char **)vf);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  fmt::v5::format<std::__cxx11::string>(&local_1b0,(v5 *)empty_line_abi_cxx11_,format_str_02);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  fmt::v5::format<char[42],int>
            (&local_1d0,(v5 *)"# valuedim: {}   ## field dimensionality\n",
             (char (*) [42])(vf_local + 4),(int *)vf);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  pcVar1 = *(char **)(vf_local + 6);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i,pcVar1,&local_1f1);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i,""
                         );
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  if (bVar2) {
    std::__cxx11::string::operator+=((string *)local_b0,"# valueunits: ");
    for (local_1f8 = 0; local_1f8 < (int)vf_local[4]; local_1f8 = local_1f8 + 1) {
      std::__cxx11::string::operator+=((string *)local_b0," unspecified");
    }
    vf = vf_local;
    std::__cxx11::string::operator+=((string *)local_b0,"\n");
  }
  else {
    fmt::v5::format<char[18],char*>
              (&local_218,(v5 *)"# valueunits: {}\n",(char (*) [18])(vf_local + 6),(char **)vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_218);
    std::__cxx11::string::~string((string *)&local_218);
  }
  pcVar1 = *(char **)(vf_local + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&i_1,pcVar1,&local_239);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i_1,
                          "");
  std::__cxx11::string::~string((string *)&i_1);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  if (bVar2) {
    std::__cxx11::string::operator+=((string *)local_b0,"# valuelabels: ");
    for (local_240 = 0; local_240 < (int)vf_local[4]; local_240 = local_240 + 1) {
      std::__cxx11::string::operator+=((string *)local_b0," unspecified");
    }
    vf = vf_local;
    std::__cxx11::string::operator+=((string *)local_b0,"\n");
    pbVar4 = extraout_RDX;
  }
  else {
    fmt::v5::format<char[19],char*>
              (&local_260,(v5 *)"# valuelabels: {}\n",(char (*) [19])(vf_local + 8),(char **)vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_260);
    std::__cxx11::string::~string((string *)&local_260);
    pbVar4 = extraout_RDX_00;
  }
  fmt::v5::format<std::__cxx11::string>(&local_280,(v5 *)empty_line_abi_cxx11_,pbVar4);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  fmt::v5::format<char[59]>
            (&local_2a0,(char (*) [59])"## Fundamental mesh measurement unit. Treated as a label:\n"
            );
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  pcVar1 = *(char **)(vf_local + 0xc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2c0,pcVar1,&local_2c1);
  bVar2 = std::operator==(&local_2c0,"");
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  if (bVar2) {
    std::__cxx11::string::operator+=((string *)local_b0,"# meshunit: unspecified\n");
    pbVar4 = extraout_RDX_01;
  }
  else {
    fmt::v5::format<char[16],char*>
              (&local_2e8,(v5 *)"# meshunit: {}\n",(char (*) [16])(vf_local + 0xc),(char **)vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_2e8);
    std::__cxx11::string::~string((string *)&local_2e8);
    pbVar4 = extraout_RDX_02;
  }
  fmt::v5::format<std::__cxx11::string>(&local_308,(v5 *)empty_line_abi_cxx11_,pbVar4);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  fmt::v5::format<char[12],float>
            (&local_328,(v5 *)"# xmin: {}\n",(char (*) [12])(vf_local + 0x16),vf);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  fmt::v5::format<char[12],float>
            (&local_348,(v5 *)"# ymin: {}\n",(char (*) [12])(vf_local + 0x17),vf);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_348);
  std::__cxx11::string::~string((string *)&local_348);
  fmt::v5::format<char[12],float>
            (&local_368,(v5 *)"# zmin: {}\n",(char (*) [12])(vf_local + 0x18),vf);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_368);
  std::__cxx11::string::~string((string *)&local_368);
  fmt::v5::format<char[12],float>
            (&local_388,(v5 *)"# xmax: {}\n",(char (*) [12])(vf_local + 0x19),vf);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  fmt::v5::format<char[12],float>
            (&local_3a8,(v5 *)"# ymax: {}\n",(char (*) [12])(vf_local + 0x1a),vf);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  fmt::v5::format<char[12],float>
            (&local_3c8,(v5 *)"# zmax: {}\n",(char (*) [12])(vf_local + 0x1b),vf);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_3c8);
  std::__cxx11::string::~string((string *)&local_3c8);
  fmt::v5::format<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&meshtype.field_2 + 8),(v5 *)empty_line_abi_cxx11_,format_str_03);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)(meshtype.field_2._M_local_buf + 8))
  ;
  std::__cxx11::string::~string((string *)(meshtype.field_2._M_local_buf + 8));
  pcVar1 = *(char **)(vf_local + 10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_408,pcVar1,&local_409);
  std::allocator<char>::~allocator((allocator<char> *)&local_409);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_408,"");
  if (bVar2) {
    std::__cxx11::string::operator=((string *)local_408,"rectangular");
  }
  fmt::v5::format<char[16],std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
             (v5 *)"# meshtype: {}\n",(char (*) [16])local_408,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vf);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)local_430);
  std::__cxx11::string::~string((string *)local_430);
  local_434 = 0.0;
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_408,"rectangular");
  if (bVar2) {
    fmt::v5::format<char[13],float>
              (&local_458,(v5 *)"# xbase: {}\n",(char (*) [13])(vf_local + 0x1d),vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    fmt::v5::format<char[13],float>
              (&local_478,(v5 *)"# ybase: {}\n",(char (*) [13])(vf_local + 0x1e),vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_478);
    std::__cxx11::string::~string((string *)&local_478);
    fmt::v5::format<char[13],float>
              (&local_498,(v5 *)"# zbase: {}\n",(char (*) [13])(vf_local + 0x1f),vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_498);
    std::__cxx11::string::~string((string *)&local_498);
    fmt::v5::format<char[17],float>
              (&local_4b8,(v5 *)"# xstepsize: {}\n",(char (*) [17])(vf_local + 0x13),vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_4b8);
    std::__cxx11::string::~string((string *)&local_4b8);
    fmt::v5::format<char[17],float>
              (&local_4d8,(v5 *)"# ystepsize: {}\n",(char (*) [17])(vf_local + 0x14),vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_4d8);
    std::__cxx11::string::~string((string *)&local_4d8);
    fmt::v5::format<char[17],float>
              (&local_4f8,(v5 *)"# zstepsize: {}\n",(char (*) [17])(vf_local + 0x15),vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_4f8);
    std::__cxx11::string::~string((string *)&local_4f8);
    fmt::v5::format<char[14],int>
              (&local_518,(v5 *)"# xnodes: {}\n",(char (*) [14])(vf_local + 0xf),(int *)vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_518);
    std::__cxx11::string::~string((string *)&local_518);
    fmt::v5::format<char[14],int>
              (&local_538,(v5 *)"# ynodes: {}\n",(char (*) [14])(vf_local + 0x10),(int *)vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_538);
    std::__cxx11::string::~string((string *)&local_538);
    fmt::v5::format<char[14],int>
              (&local_558,(v5 *)"# znodes: {}\n",(char (*) [14])(vf_local + 0x11),(int *)vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_558);
    std::__cxx11::string::~string((string *)&local_558);
    local_434 = (float)((int)vf_local[0xf] * (int)vf_local[0x10] * (int)vf_local[0x11]);
    vf = vf_local;
    pbVar4 = extraout_RDX_03;
  }
  else {
    pcVar1 = *(char **)(vf_local + 10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_578,pcVar1,&local_579);
    bVar2 = std::operator==(&local_578,"irregular");
    std::__cxx11::string::~string((string *)&local_578);
    std::allocator<char>::~allocator((allocator<char> *)&local_579);
    if (!bVar2) {
      fmt::v5::format<char[137],char_const*,char*>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&n_cols,
                 (v5 *)
                 "write_segment not writing out any data to file \"{}\", because meshtype is invalid: \"{}\". You may want to check the segment you passed in."
                 ,(char (*) [137])segment_local,(char **)(vf_local + 10),args_1);
      std::__cxx11::string::operator=
                ((string *)(segment_local->valueunits + 0x98),(string *)&n_cols);
      std::__cxx11::string::~string((string *)&n_cols);
      file_local._4_4_ = -2;
      local_5c4[0] = '\x01';
      local_5c4[1] = '\0';
      local_5c4[2] = '\0';
      local_5c4[3] = '\0';
      goto LAB_0016c5fe;
    }
    fmt::v5::format<char[18],int>
              (&local_5a0,(v5 *)"# pointcount: {}\n",(char (*) [18])(vf_local + 0xe),(int *)vf);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
    local_434 = vf_local[0xe];
    pbVar4 = extraout_RDX_04;
  }
  local_5c8 = vf_local[4];
  if ((int)local_5c8 * (int)local_434 < 1) {
    fmt::v5::format<char[135],int,int,char_const*>
              (&local_5e8,
               (v5 *)
               "write_segment not writing out any data, because n_cols*n_rows={}*{}<=0 for file \"{}\". You may want to check the segment you passed in."
               ,(char (*) [135])&local_5c8,(int *)&local_434,(int *)segment_local,
               (char **)CONCAT44(in_register_0000008c,format));
    std::__cxx11::string::operator=
              ((string *)(segment_local->valueunits + 0x98),(string *)&local_5e8);
    std::__cxx11::string::~string((string *)&local_5e8);
    file_local._4_4_ = -2;
    local_5c4[0] = '\x01';
    local_5c4[1] = '\0';
    local_5c4[2] = '\0';
    local_5c4[3] = '\0';
    goto LAB_0016c5fe;
  }
  fmt::v5::format<std::__cxx11::string>(&local_608,(v5 *)empty_line_abi_cxx11_,pbVar4);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_608);
  std::__cxx11::string::~string((string *)&local_608);
  fmt::v5::format<char[15]>(&local_628,(char (*) [15])"# End: Header\n");
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_628);
  std::__cxx11::string::~string((string *)&local_628);
  fmt::v5::format<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&datatype_out.field_2 + 8),(v5 *)empty_line_abi_cxx11_,format_str_04);
  std::__cxx11::string::operator+=
            ((string *)local_b0,(string *)(datatype_out.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(datatype_out.field_2._M_local_buf + 8));
  if (local_30 == 0) {
    local_30 = 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_668,"",&local_669);
  std::allocator<char>::~allocator((allocator<char> *)&local_669);
  if (local_30 == 2) {
    std::__cxx11::string::operator=(local_668,"Binary 8");
  }
  else if (local_30 == 1) {
    std::__cxx11::string::operator=(local_668,"Binary 4");
  }
  else if (local_30 == 3) {
    std::__cxx11::string::operator=(local_668,"Text");
  }
  else if (local_30 == 4) {
    std::__cxx11::string::operator=(local_668,"CSV");
  }
  fmt::v5::format<char[18],std::__cxx11::string>
            (&local_690,(v5 *)"# Begin: Data {}\n",(char (*) [18])local_668,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vf);
  std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_690);
  std::__cxx11::string::~string((string *)&local_690);
  vf_00 = _format_local;
  output_to_file_00 = local_b0;
  n_rows_00 = local_434;
  n_cols_00 = local_5c8;
  if (((local_30 == 0) || (local_30 == 2)) || (local_30 == 1)) {
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(uint)local_434;
    append_data_bin_to_string<float>
              (local_b0,(float *)_format_local,(int)local_5c8,(int)local_434,local_30);
LAB_0016bfd0:
    fmt::v5::format<char[16],std::__cxx11::string>
              (&local_720,(v5 *)"# End: Data {}\n",(char (*) [16])local_668,pbVar4);
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&local_720);
    std::__cxx11::string::~string((string *)&local_720);
    fmt::v5::format<char[16]>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &handle.field_0x1f8,(char (*) [16])"# End: Segment\n");
    std::__cxx11::string::operator+=((string *)local_b0,(string *)&handle.field_0x1f8);
    std::__cxx11::string::~string((string *)&handle.field_0x1f8);
    if ((local_29 & 1) == 0) {
      pcVar1 = segment_local->title;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_be0,pcVar1,&local_be1);
      file_handle::file_handle((file_handle *)local_bc0,&local_be0,false);
      std::__cxx11::string::~string((string *)&local_be0);
      std::allocator<char>::~allocator((allocator<char> *)&local_be1);
      segment_local->valuedim = 0;
      *(undefined4 *)&segment_local->comment = 2;
      local_c58 = &local_c50;
      top_header_string_abi_cxx11_();
      local_c58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c30;
      std::__cxx11::string::string((string *)local_c58,(string *)local_b0);
      local_c10 = &local_c50;
      local_c08 = 2;
      this_02 = (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&ex + 7);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(this_02);
      __l._M_len = local_c08;
      __l._M_array = local_c10;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_c00,__l,this_02);
      file_handle::write((file_handle *)local_bc0,(int)&local_c00,__buf_00,(size_t)this_02);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c00);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&ex + 7));
      local_e20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_c10;
      do {
        local_e20 = local_e20 + -1;
        std::__cxx11::string::~string((string *)local_e20);
      } while (local_e20 != &local_c50);
      file_handle::~file_handle((file_handle *)local_bc0);
    }
    else {
      pcVar1 = segment_local->title;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_960,pcVar1,&local_961);
      file_handle::file_handle((file_handle *)local_940,&local_960,true);
      std::__cxx11::string::~string((string *)&local_960);
      std::allocator<char>::~allocator((allocator<char> *)&local_961);
      std::__cxx11::string::string((string *)&local_9b0,(string *)local_b0);
      local_990 = &local_9b0;
      local_988 = 1;
      this_01 = &handle_1.field_0x1ff;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_01);
      __l_00._M_len = local_988;
      __l_00._M_array = local_990;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_980,__l_00,(allocator_type *)this_01);
      file_handle::write((file_handle *)local_940,(int)&local_980,__buf,(size_t)this_01);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_980);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&handle_1.field_0x1ff);
      local_dc8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_990;
      do {
        local_dc8 = local_dc8 + -1;
        std::__cxx11::string::~string((string *)local_dc8);
      } while (local_dc8 != &local_9b0);
      file_handle::~file_handle((file_handle *)local_940);
    }
    *(undefined1 *)((long)&segment_local->comment + 4) = 1;
    *(undefined1 *)((long)&segment_local->comment + 5) = 1;
    file_local._4_4_ = increment_n_segments((ovf_file *)segment_local);
  }
  else {
    if (local_30 == 3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6b0,"",&local_6b1);
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(uint)n_rows_00;
      append_data_txt_to_string<float>
                (output_to_file_00,(float *)vf_00,(int)n_cols_00,(int)n_rows_00,&local_6b0);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
      goto LAB_0016bfd0;
    }
    if (local_30 == 4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6d8,",",&local_6d9);
      pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(uint)n_rows_00;
      append_data_txt_to_string<float>
                (output_to_file_00,(float *)vf_00,(int)n_cols_00,(int)n_rows_00,&local_6d8);
      std::__cxx11::string::~string((string *)&local_6d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_6d9);
      goto LAB_0016bfd0;
    }
    fmt::v5::format<char[114],int>
              (&local_700,
               (v5 *)
               "write_segment not writing out any data, because format \"{}\" is invalid. You may want to check what you passed in."
               ,(char (*) [114])&local_30,(int *)vf);
    std::__cxx11::string::operator=
              ((string *)(segment_local->valueunits + 0x98),(string *)&local_700);
    std::__cxx11::string::~string((string *)&local_700);
    file_local._4_4_ = -2;
  }
  local_5c4[0] = '\x01';
  local_5c4[1] = '\0';
  local_5c4[2] = '\0';
  local_5c4[3] = '\0';
  std::__cxx11::string::~string(local_668);
LAB_0016c5fe:
  std::__cxx11::string::~string((string *)local_408);
  return file_local._4_4_;
}

Assistant:

int segment( ovf_file *file, const ovf_segment * segment, const T * vf,
                const bool append = false, int format = OVF_FORMAT_BIN8 )
    try
    {
        if( file->_state->file_contents.size() > 0 && append )
            file->_state->file_contents.push_back("");
        else
            file->_state->file_contents = {""};

        int index = file->_state->file_contents.size()-1;
        std::string & output_to_file = file->_state->file_contents[index];
        output_to_file.reserve( int( 0x08000000 ) );  // reserve 128[MByte]

        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "# Begin: Segment\n" );
        output_to_file += fmt::format( "# Begin: Header\n" );
        output_to_file += fmt::format( empty_line );

        output_to_file += fmt::format( "# Title: {}\n", segment->title );
        output_to_file += fmt::format( empty_line );

        output_to_file += fmt::format( "# Desc: {}\n", segment->comment );
        output_to_file += fmt::format( empty_line );

        // The value dimension is always 3 since we are writting Vector3-data
        output_to_file += fmt::format( "# valuedim: {}   ## field dimensionality\n", segment->valuedim );

        //
        if( std::string(segment->valueunits) == "" )
        {
            output_to_file += "# valueunits: ";
            for( int i=0; i<segment->valuedim; ++i )
                output_to_file += " unspecified";
            output_to_file += "\n";
        }
        else
            output_to_file += fmt::format( "# valueunits: {}\n", segment->valueunits );

        //
        if( std::string(segment->valuelabels) == "" )
        {
            output_to_file += "# valuelabels: ";
            for( int i=0; i<segment->valuedim; ++i )
                output_to_file += " unspecified";
            output_to_file += "\n";
        }
        else
            output_to_file += fmt::format( "# valuelabels: {}\n", segment->valuelabels );

        // spatial unit
        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "## Fundamental mesh measurement unit. Treated as a label:\n" );
        if( std::string(segment->meshunit) == "" )
            output_to_file += "# meshunit: unspecified\n";
        else
            output_to_file += fmt::format( "# meshunit: {}\n", segment->meshunit );

        // extent
        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "# xmin: {}\n", segment->bounds_min[0] );
        output_to_file += fmt::format( "# ymin: {}\n", segment->bounds_min[1] );
        output_to_file += fmt::format( "# zmin: {}\n", segment->bounds_min[2] );
        output_to_file += fmt::format( "# xmax: {}\n", segment->bounds_max[0] );
        output_to_file += fmt::format( "# ymax: {}\n", segment->bounds_max[1] );
        output_to_file += fmt::format( "# zmax: {}\n", segment->bounds_max[2] );
        output_to_file += fmt::format( empty_line );

        // Type of mesh and further keywords depending on it
        std::string meshtype = segment->meshtype;
        if( meshtype == "" )
            meshtype = "rectangular";
        output_to_file += fmt::format( "# meshtype: {}\n", meshtype );

        int n_rows = 0;
        if( meshtype == "rectangular" )
        {
            // Latice origin in space
            output_to_file += fmt::format( "# xbase: {}\n", segment->origin[0] );
            output_to_file += fmt::format( "# ybase: {}\n", segment->origin[1] );
            output_to_file += fmt::format( "# zbase: {}\n", segment->origin[2] );

            // Mesh spacing
            output_to_file += fmt::format( "# xstepsize: {}\n", segment->step_size[0] );
            output_to_file += fmt::format( "# ystepsize: {}\n", segment->step_size[1] );
            output_to_file += fmt::format( "# zstepsize: {}\n", segment->step_size[2] );

            // Number of nodes along each direction
            output_to_file += fmt::format( "# xnodes: {}\n", segment->n_cells[0] );
            output_to_file += fmt::format( "# ynodes: {}\n", segment->n_cells[1] );
            output_to_file += fmt::format( "# znodes: {}\n", segment->n_cells[2] );

            n_rows = segment->n_cells[0]*segment->n_cells[1]*segment->n_cells[2];
        }
        else if( std::string(segment->meshtype) == "irregular" )
        {
            output_to_file += fmt::format( "# pointcount: {}\n", segment->pointcount );
            n_rows = segment->pointcount;
        }
        else
        {
            file->_state->message_latest = fmt::format(
                "write_segment not writing out any data to file \"{}\", because meshtype is invalid: \"{}\". "
                "You may want to check the segment you passed in.",
                file->file_name, segment->meshtype);
            return OVF_ERROR;
        }

        int n_cols = segment->valuedim;

        // Check that we actually read in any data
        if( n_cols*n_rows <= 0 )
        {
            file->_state->message_latest = fmt::format(
                "write_segment not writing out any data, because n_cols*n_rows={}*{}<=0 for file \"{}\". "
                "You may want to check the segment you passed in.",
                n_cols, n_rows, file->file_name);
            return OVF_ERROR;
        }

        output_to_file += fmt::format( empty_line );
        output_to_file += fmt::format( "# End: Header\n" );
        output_to_file += fmt::format( empty_line );

        if( sizeof(T) == sizeof(float) && format == OVF_FORMAT_BIN )
            format = OVF_FORMAT_BIN4;
        else if( sizeof(T) == sizeof(double) && format == OVF_FORMAT_BIN )
            format = OVF_FORMAT_BIN8;

        std::string datatype_out = "";
        if ( format == OVF_FORMAT_BIN8 )
            datatype_out = "Binary 8";
        else if ( format == OVF_FORMAT_BIN4 )
            datatype_out = "Binary 4";
        else if( format == OVF_FORMAT_TEXT )
            datatype_out = "Text";
        else if( format == OVF_FORMAT_CSV )
            datatype_out = "CSV";

        // Data
        output_to_file += fmt::format( "# Begin: Data {}\n", datatype_out );

        if ( format == OVF_FORMAT_BIN || format == OVF_FORMAT_BIN8 || format == OVF_FORMAT_BIN4 )
            append_data_bin_to_string( output_to_file, vf, n_cols, n_rows, format );
        else if ( format == OVF_FORMAT_TEXT )
            append_data_txt_to_string( output_to_file, vf, n_cols, n_rows );
        else if ( format == OVF_FORMAT_CSV )
            append_data_txt_to_string( output_to_file, vf, n_cols, n_rows, "," );
        else
        {
            file->_state->message_latest = fmt::format(
                "write_segment not writing out any data, because format \"{}\" is invalid. "
                "You may want to check what you passed in.", format);
            return OVF_ERROR;
        }
        output_to_file += fmt::format( "# End: Data {}\n", datatype_out );
        output_to_file += fmt::format( "# End: Segment\n" );

        // Append the #End keywords
        if( append )
        {
            file_handle handle(file->file_name, true);
            handle.write( {output_to_file} );
        }
        else
        {
            file_handle handle(file->file_name, false);
            file->n_segments = 0;
            file->version = 2;
            handle.write( {top_header_string(), output_to_file} );
        }
        file->found  = true;
        file->is_ovf = true;

        // Increment the n_segments after succesfully appending the segment body to the file
        return increment_n_segments(file);
    }
    catch( const std::exception & ex )
    {
        file->_state->message_latest = fmt::format("Caught std::exception \"{}\"", ex.what());
        return OVF_ERROR;
    }
    catch( ... )
    {
        return OVF_ERROR;
    }